

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Vec_Int_t * Gia_ManComputeCarryOuts(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  int nCap;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iBox;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  nCap = Tim_ManBoxNum(p_00);
  p_01 = Vec_IntAlloc(nCap);
  iBox = 0;
  if (nCap < 1) {
    nCap = 0;
  }
  do {
    if (nCap == iBox) {
      return p_01;
    }
    iVar1 = Tim_ManBoxInputLast(p_00,iBox);
    pGVar3 = Gia_ManCo(p,iVar1);
    uVar4 = (ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
    if (((undefined1  [12])pGVar3[-uVar4] & (undefined1  [12])0x9fffffff) ==
        (undefined1  [12])0x9fffffff) {
      pGVar3 = pGVar3 + -uVar4;
      iVar1 = Gia_ObjCioId(pGVar3);
      iVar1 = Tim_ManBoxForCi(p_00,iVar1);
      if (iVar1 != -1) {
        if (((undefined1  [12])*pGVar3 & (undefined1  [12])0x9fffffff) !=
            (undefined1  [12])0x9fffffff) {
          __assert_fail("Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                        ,400,"Vec_Int_t *Gia_ManComputeCarryOuts(Gia_Man_t *)");
        }
        iVar2 = Gia_ObjCioId(pGVar3);
        iVar1 = Tim_ManBoxOutputLast(p_00,iVar1);
        if (iVar2 == iVar1) {
          iVar1 = Gia_ObjId(p,pGVar3);
          Vec_IntPush(p_01,iVar1);
        }
      }
    }
    iBox = iBox + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManComputeCarryOuts( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int i, iLast, iBox, nBoxes =  Tim_ManBoxNum( pManTime );
    Vec_Int_t * vCarryOuts = Vec_IntAlloc( nBoxes );
    for ( i = 0; i < nBoxes; i++ )
    {
        iLast = Tim_ManBoxInputLast( pManTime, i );
        pObj = Gia_ObjFanin0( Gia_ManCo(p, iLast) );
        if ( !Gia_ObjIsCi(pObj) )
            continue;
        iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
        if ( iBox == -1 ) 
            continue;
        assert( Gia_ObjIsCi(pObj) );
        if ( Gia_ObjCioId(pObj) == Tim_ManBoxOutputLast(pManTime, iBox) )
            Vec_IntPush( vCarryOuts, Gia_ObjId(p, pObj) );
    }
    return vCarryOuts;
}